

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

void __thiscall kj::UnixEventPort::FdObserver::fire(FdObserver *this,short events)

{
  PromiseFulfiller<void> *pPVar1;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_e0;
  undefined1 local_c9;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_c8;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *f_3;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_f498;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_b0;
  undefined1 local_99;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_98;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *f_2;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_f491;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_80;
  undefined1 local_69;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_68;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *f_1;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_f484;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_40;
  undefined1 local_29;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_28;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *f;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_f477;
  FdObserver *pFStack_10;
  short events_local;
  FdObserver *this_local;
  
  _f477._6_2_ = events;
  pFStack_10 = this;
  if ((events & 0x2019U) != 0) {
    if ((events & 0x2010U) == 0) {
      _f477._4_1_ = 0;
      Maybe<bool>::operator=(&this->atEnd,(bool *)((long)&_f477 + 4));
    }
    else {
      _f477._5_1_ = 1;
      Maybe<bool>::operator=(&this->atEnd,(bool *)((long)&_f477 + 5));
    }
    f = kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>(&this->readFulfiller);
    if (f != (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0) {
      local_28 = f;
      pPVar1 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(f);
      (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_29);
      Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe();
      Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
                (&this->readFulfiller,&local_40);
      Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_40);
    }
  }
  if (((_f477._6_2_ & 0x1c) != 0) &&
     (f_1 = kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>(&this->writeFulfiller),
     f_1 != (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0)) {
    local_68 = f_1;
    pPVar1 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(f_1);
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_69);
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe();
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
              (&this->writeFulfiller,&local_80);
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_80);
  }
  if (((_f477._6_2_ & 0x18) != 0) &&
     (f_2 = kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>(&this->hupFulfiller),
     f_2 != (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0)) {
    local_98 = f_2;
    pPVar1 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(f_2);
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_99);
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe();
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
              (&this->hupFulfiller,&local_b0);
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_b0);
  }
  if (((_f477._6_2_ & 2) != 0) &&
     (local_c8 = kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>
                           (&this->urgentFulfiller),
     local_c8 != (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0)) {
    f_3 = local_c8;
    pPVar1 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(local_c8);
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_c9);
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe();
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
              (&this->urgentFulfiller,&local_e0);
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_e0);
  }
  return;
}

Assistant:

void UnixEventPort::FdObserver::fire(short events) {
  if (events & (EPOLLIN | EPOLLHUP | EPOLLRDHUP | EPOLLERR)) {
    if (events & (EPOLLHUP | EPOLLRDHUP)) {
      atEnd = true;
    } else {
      // Since we didn't receive EPOLLRDHUP, we know that we're not at the end.
      atEnd = false;
    }

    KJ_IF_SOME(f, readFulfiller) {
      f->fulfill();
      readFulfiller = kj::none;
    }
  }

  if (events & (EPOLLOUT | EPOLLHUP | EPOLLERR)) {
    KJ_IF_SOME(f, writeFulfiller) {
      f->fulfill();
      writeFulfiller = kj::none;
    }
  }

  if (events & (EPOLLHUP | EPOLLERR)) {
    KJ_IF_SOME(f, hupFulfiller) {
      f->fulfill();
      hupFulfiller = kj::none;
    }
  }

  if (events & EPOLLPRI) {
    KJ_IF_SOME(f, urgentFulfiller) {
      f->fulfill();
      urgentFulfiller = kj::none;
    }
  }
}